

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O1

TCGArg do_constant_folding_cond2(TCGArg *p1,TCGArg *p2,TCGCond c)

{
  TCGTemp *ts1;
  TCGTemp *ts1_00;
  TCGTemp *ts2;
  TCGTemp *ts2_00;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  _Bool _Var4;
  TCGArg unaff_RBP;
  TCGArg TVar5;
  ulong y;
  
  ts1 = (TCGTemp *)*p1;
  ts1_00 = (TCGTemp *)p1[1];
  ts2 = (TCGTemp *)*p2;
  ts2_00 = (TCGTemp *)p2[1];
  pcVar1 = (char *)ts2->state_ptr;
  if ((*pcVar1 != '\x01') || (pcVar2 = (char *)ts2_00->state_ptr, *pcVar2 != '\x01'))
  goto LAB_00d54688;
  y = *(long *)(pcVar2 + 0x18) << 0x20 | (ulong)*(uint *)(pcVar1 + 0x18);
  pcVar1 = (char *)ts1->state_ptr;
  if ((*pcVar1 == '\x01') && (pcVar2 = (char *)ts1_00->state_ptr, *pcVar2 == '\x01')) {
    _Var4 = do_constant_folding_cond_64
                      (*(long *)(pcVar2 + 0x18) << 0x20 | (ulong)*(uint *)(pcVar1 + 0x18),y,c);
    unaff_RBP = (TCGArg)_Var4;
LAB_00d54682:
    bVar3 = false;
  }
  else {
    if (y == 0) {
      if (c == TCG_COND_LTU) {
        unaff_RBP = 0;
      }
      else {
        if (c != TCG_COND_GEU) goto LAB_00d5466b;
        unaff_RBP = 1;
      }
      goto LAB_00d54682;
    }
LAB_00d5466b:
    bVar3 = true;
  }
  if (!bVar3) {
    return unaff_RBP;
  }
LAB_00d54688:
  _Var4 = ts_are_copies(ts1,ts2);
  TVar5 = 2;
  if ((_Var4) && (_Var4 = ts_are_copies(ts1_00,ts2_00), _Var4)) {
    _Var4 = do_constant_folding_cond_eq(c);
    TVar5 = (TCGArg)_Var4;
  }
  return TVar5;
}

Assistant:

static TCGArg do_constant_folding_cond2(TCGArg *p1, TCGArg *p2, TCGCond c)
{
    TCGArg al = p1[0], ah = p1[1];
    TCGArg bl = p2[0], bh = p2[1];

    if (arg_is_const(bl) && arg_is_const(bh)) {
        tcg_target_ulong blv = arg_info(bl)->val;
        tcg_target_ulong bhv = arg_info(bh)->val;
        uint64_t b = deposit64(blv, 32, 32, bhv);

        if (arg_is_const(al) && arg_is_const(ah)) {
            tcg_target_ulong alv = arg_info(al)->val;
            tcg_target_ulong ahv = arg_info(ah)->val;
            uint64_t a = deposit64(alv, 32, 32, ahv);
            return do_constant_folding_cond_64(a, b, c);
        }
        if (b == 0) {
            switch (c) {
            case TCG_COND_LTU:
                return 0;
            case TCG_COND_GEU:
                return 1;
            default:
                break;
            }
        }
    }
    if (args_are_copies(al, bl) && args_are_copies(ah, bh)) {
        return do_constant_folding_cond_eq(c);
    }
    return 2;
}